

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

void ScalePlane(uint8_t *src,int src_stride,int src_width,int src_height,uint8_t *dst,int dst_stride
               ,int dst_width,int dst_height,FilterMode filtering)

{
  FilterMode FVar1;
  int iVar2;
  int in_ECX;
  FilterMode in_EDX;
  uint8_t *unaff_RBX;
  int in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  int in_R9D;
  FilterMode unaff_retaddr;
  int unaff_retaddr_00;
  FilterMode in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  FilterMode in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  int in_stack_00000028;
  int in_stack_0000002c;
  FilterMode in_stack_00000030;
  int in_stack_00000034;
  int dy;
  undefined4 in_stack_00000048;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  FilterMode FVar3;
  int in_stack_ffffffffffffffd0;
  int dst_width_00;
  FilterMode in_stack_ffffffffffffffe0;
  
  FVar1 = ScaleFilterReduce(in_EDX,in_ECX,in_stack_00000008,in_stack_00000010,in_stack_00000018);
  if (in_ECX < 0) {
    in_ECX = -in_ECX;
    in_RDI = in_RDI + (in_ECX + -1) * in_ESI;
  }
  if ((in_stack_00000008 == in_EDX) && (in_stack_00000010 == in_ECX)) {
    CopyPlane((uint8_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
              (uint8_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  }
  else if ((in_stack_00000008 == in_EDX) && (FVar1 != kFilterBox)) {
    iVar2 = FixedDiv_X86(in_ECX,in_stack_00000010);
    ScalePlaneVertical(in_R9D,iVar2,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                       in_stack_ffffffffffffffc4,(uint8_t *)CONCAT44(in_stack_ffffffffffffffbc,1),
                       (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_EDX,(int)in_RDI,
                       (int)unaff_RBX,unaff_retaddr,in_stack_00000008);
  }
  else {
    FVar3 = in_stack_00000008;
    iVar2 = libyuv::Abs(in_EDX);
    dst_width_00 = (int)((ulong)in_R8 >> 0x20);
    if (((int)FVar3 <= iVar2) && (in_stack_00000010 <= in_ECX)) {
      if ((in_stack_00000008 << 2 == in_EDX * 3) && (in_stack_00000010 << 2 == in_ECX * 3)) {
        libyuv::ScalePlaneDown34
                  (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                   in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                   (uint8_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_R8,
                   in_stack_ffffffffffffffe0);
        return;
      }
      if ((in_stack_00000008 << 1 == in_EDX) && (in_stack_00000010 << 1 == in_ECX)) {
        libyuv::ScalePlaneDown2
                  (in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                   unaff_retaddr_00,unaff_retaddr,
                   (uint8_t *)CONCAT44(in_stack_00000024,in_stack_00000020),
                   (uint8_t *)CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000030);
        return;
      }
      if ((in_stack_00000008 << 3 == in_EDX * 3) && (in_stack_00000010 << 3 == in_ECX * 3)) {
        libyuv::ScalePlaneDown38
                  (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                   in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                   (uint8_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_R8,
                   in_stack_ffffffffffffffe0);
        return;
      }
      if (((in_stack_00000008 << 2 == in_EDX) && (in_stack_00000010 << 2 == in_ECX)) &&
         ((FVar1 == kFilterBox || (FVar1 == kFilterNone)))) {
        libyuv::ScalePlaneDown4
                  (in_ECX,in_stack_ffffffffffffffe0,dst_width_00,(int)in_R8,in_R9D,
                   in_stack_ffffffffffffffd0,in_RDI,unaff_RBX,unaff_retaddr);
        return;
      }
    }
    if ((FVar1 == kFilterBox) && (in_stack_00000010 * 2 < in_ECX)) {
      libyuv::ScalePlaneBox
                (in_stack_00000024,in_stack_00000020,in_stack_0000001c,3,in_stack_00000014,
                 in_stack_00000010,(uint8_t *)CONCAT44(in_stack_00000034,in_stack_00000030),
                 (uint8_t *)CONCAT44(dst_stride,dy));
    }
    else if ((FVar1 == kFilterNone) || (in_stack_00000010 <= in_ECX)) {
      if (FVar1 == kFilterNone) {
        libyuv::ScalePlaneSimple
                  (in_ECX,in_stack_ffffffffffffffe0,dst_width_00,(int)in_R8,in_R9D,
                   in_stack_ffffffffffffffd0,in_RDI,unaff_RBX);
      }
      else {
        ScalePlaneBilinearDown
                  (in_stack_00000014,in_stack_00000010,in_stack_0000000c,in_stack_00000008,
                   unaff_retaddr_00,unaff_retaddr,
                   (uint8_t *)CONCAT44(in_stack_00000024,in_stack_00000020),
                   (uint8_t *)CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000030);
      }
    }
    else {
      ScalePlaneBilinearUp
                (in_stack_00000034,in_stack_00000030,in_stack_0000002c,in_stack_00000028,
                 in_stack_00000024,in_stack_00000020,dst,
                 (uint8_t *)CONCAT44(src_height,in_stack_00000048),src_width);
    }
  }
  return;
}

Assistant:

LIBYUV_API
void ScalePlane(const uint8_t* src,
                int src_stride,
                int src_width,
                int src_height,
                uint8_t* dst,
                int dst_stride,
                int dst_width,
                int dst_height,
                enum FilterMode filtering) {
  // Simplify filtering when possible.
  filtering = ScaleFilterReduce(src_width, src_height, dst_width, dst_height,
                                filtering);

  // Negative height means invert the image.
  if (src_height < 0) {
    src_height = -src_height;
    src = src + (src_height - 1) * src_stride;
    src_stride = -src_stride;
  }

  // Use specialized scales to improve performance for common resolutions.
  // For example, all the 1/2 scalings will use ScalePlaneDown2()
  if (dst_width == src_width && dst_height == src_height) {
    // Straight copy.
    CopyPlane(src, src_stride, dst, dst_stride, dst_width, dst_height);
    return;
  }
  if (dst_width == src_width && filtering != kFilterBox) {
    int dy = FixedDiv(src_height, dst_height);
    // Arbitrary scale vertically, but unscaled horizontally.
    ScalePlaneVertical(src_height, dst_width, dst_height, src_stride,
                       dst_stride, src, dst, 0, 0, dy, 1, filtering);
    return;
  }
  if (dst_width <= Abs(src_width) && dst_height <= src_height) {
    // Scale down.
    if (4 * dst_width == 3 * src_width && 4 * dst_height == 3 * src_height) {
      // optimized, 3/4
      ScalePlaneDown34(src_width, src_height, dst_width, dst_height, src_stride,
                       dst_stride, src, dst, filtering);
      return;
    }
    if (2 * dst_width == src_width && 2 * dst_height == src_height) {
      // optimized, 1/2
      ScalePlaneDown2(src_width, src_height, dst_width, dst_height, src_stride,
                      dst_stride, src, dst, filtering);
      return;
    }
    // 3/8 rounded up for odd sized chroma height.
    if (8 * dst_width == 3 * src_width && 8 * dst_height == 3 * src_height) {
      // optimized, 3/8
      ScalePlaneDown38(src_width, src_height, dst_width, dst_height, src_stride,
                       dst_stride, src, dst, filtering);
      return;
    }
    if (4 * dst_width == src_width && 4 * dst_height == src_height &&
        (filtering == kFilterBox || filtering == kFilterNone)) {
      // optimized, 1/4
      ScalePlaneDown4(src_width, src_height, dst_width, dst_height, src_stride,
                      dst_stride, src, dst, filtering);
      return;
    }
  }
  if (filtering == kFilterBox && dst_height * 2 < src_height) {
    ScalePlaneBox(src_width, src_height, dst_width, dst_height, src_stride,
                  dst_stride, src, dst);
    return;
  }
  if (filtering && dst_height > src_height) {
    ScalePlaneBilinearUp(src_width, src_height, dst_width, dst_height,
                         src_stride, dst_stride, src, dst, filtering);
    return;
  }
  if (filtering) {
    ScalePlaneBilinearDown(src_width, src_height, dst_width, dst_height,
                           src_stride, dst_stride, src, dst, filtering);
    return;
  }
  ScalePlaneSimple(src_width, src_height, dst_width, dst_height, src_stride,
                   dst_stride, src, dst);
}